

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

void reshape(GLFWwindow *window,int width,int height)

{
  GLfloat zfar;
  GLfloat znear;
  GLfloat xmax;
  GLfloat h;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  glViewport(0,0,width,height);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glFrustum(0xc004000000000000,0x4004000000000000,(double)(((float)height / (float)width) * -2.5),
            (double)(((float)height / (float)width) * 2.5),0x4014000000000000,0x403e000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glTranslatef();
  return;
}

Assistant:

void reshape( GLFWwindow* window, int width, int height )
{
  GLfloat h = (GLfloat) height / (GLfloat) width;
  GLfloat xmax, znear, zfar;

  znear = 5.0f;
  zfar  = 30.0f;
  xmax  = znear * 0.5f;

  glViewport( 0, 0, (GLint) width, (GLint) height );
  glMatrixMode( GL_PROJECTION );
  glLoadIdentity();
  glFrustum( -xmax, xmax, -xmax*h, xmax*h, znear, zfar );
  glMatrixMode( GL_MODELVIEW );
  glLoadIdentity();
  glTranslatef( 0.0, 0.0, -20.0 );
}